

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void __thiscall
helics::ValueFederate::registerValueInterfacesToml(ValueFederate *this,string *tomlString)

{
  pointer pbVar1;
  pointer pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string_view units_00;
  string_view units_01;
  string_view units_02;
  string_view units_03;
  string_view units_04;
  size_type sVar12;
  bool bVar13;
  value_type *pvVar14;
  array_type *paVar15;
  anon_class_8_1_66e135f8 callback;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar16;
  string_type *psVar17;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar18;
  anon_class_8_1_ba1d534b aVar19;
  InvalidParameter *pIVar20;
  value *extraout_RDX;
  value *pvVar21;
  value *extraout_RDX_00;
  value *extraout_RDX_01;
  value *extraout_RDX_02;
  value *extraout_RDX_03;
  value *extraout_RDX_04;
  pointer pbVar22;
  ulong in_R9;
  basic_value<toml::type_config> *target;
  pointer pbVar23;
  string_view key;
  string_view key_00;
  string_view name_00;
  string_view info_00;
  string_view target_00;
  string_view target_01;
  string_view target_02;
  string_view key_01;
  string_view target_03;
  string_view key_02;
  string_view key_03;
  string_view name_01;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view type_00;
  string_view type_01;
  string_view type_02;
  string_view type_03;
  string_view type_04;
  bool defaultGlobal;
  ValueFederate *local_440;
  string units_1;
  allocator<char> local_411 [9];
  string info;
  undefined1 local_3e8 [32];
  string type;
  string units;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  size_type local_1e8;
  pointer pcStack_1e0;
  size_type local_1d8;
  pointer pcStack_1d0;
  size_type local_1c8;
  pointer pcStack_1c0;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  value doc;
  
  local_440 = this;
  toml::basic_value<toml::type_config>::basic_value(&doc);
  fileops::loadToml((value *)&type,tomlString);
  toml::basic_value<toml::type_config>::operator=(&doc,(basic_value<toml::type_config> *)&type);
  toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&type);
  defaultGlobal = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"defaultglobal",(allocator<char> *)&units);
  fileops::replaceIfMember<bool>(&doc,&type,&defaultGlobal);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"publications",(allocator<char> *)&units);
  bVar13 = fileops::isMember(&doc,&type);
  std::__cxx11::string::~string((string *)&type);
  if (bVar13) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"publications",(allocator<char> *)&units);
    pvVar14 = toml::basic_value<toml::type_config>::at(&doc,&type);
    std::__cxx11::string::~string((string *)&type);
    if (pvVar14->type_ != array) {
      pIVar20 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message._M_str = "publications section in toml file must be an array";
      message._M_len = 0x32;
      InvalidParameter::InvalidParameter(pIVar20,message);
      __cxa_throw(pIVar20,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar15 = toml::basic_value<toml::type_config>::as_array(pvVar14);
    pbVar1 = (paVar15->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pvVar21 = extraout_RDX;
    for (pbVar22 = (paVar15->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar22 != pbVar1;
        pbVar22 = pbVar22 + 1) {
      fileops::getName_abi_cxx11_(&name,(fileops *)pbVar22,pvVar21);
      key._M_str = name._M_dataplus._M_p;
      key._M_len = name._M_string_length;
      callback.pubObj =
           ValueFederateManager::getPublication
                     ((local_440->vfManager)._M_t.
                      super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                      .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,key
                     );
      if (((callback.pubObj)->super_Interface).handle.hid == -1700000000) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&units,"type",(allocator<char> *)&units_1);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = in_R9;
        fileops::getOrDefault
                  (&type,(fileops *)pbVar22,(basic_value<toml::type_config> *)&units,(string *)0x0,
                   (string_view)(auVar3 << 0x40));
        std::__cxx11::string::~string((string *)&units);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&units_1,"unit",(allocator<char> *)local_3e8);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = in_R9;
        fileops::getOrDefault
                  (&units,(fileops *)pbVar22,(value *)&units_1,(string *)0x0,
                   (string_view)(auVar4 << 0x40));
        std::__cxx11::string::~string((string *)&units_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&units_1,"units",(allocator<char> *)local_3e8);
        fileops::replaceIfMember(pbVar22,&units_1,&units);
        std::__cxx11::string::~string((string *)&units_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&units_1,"global",(allocator<char> *)local_3e8);
        bVar13 = fileops::getOrDefault(pbVar22,&units_1,defaultGlobal);
        std::__cxx11::string::~string((string *)&units_1);
        if (bVar13) {
          units_1._M_dataplus._M_p = (pointer)units._M_string_length;
          units_1._M_string_length = (size_type)units._M_dataplus._M_p;
          units_00._M_str = units._M_dataplus._M_p;
          units_00._M_len = units._M_string_length;
          key_00._M_str = name._M_dataplus._M_p;
          key_00._M_len = name._M_string_length;
          type_00._M_str = type._M_dataplus._M_p;
          type_00._M_len = type._M_string_length;
          callback.pubObj =
               ValueFederateManager::registerPublication
                         ((local_440->vfManager)._M_t.
                          super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                          .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl
                          ,key_00,type_00,units_00);
        }
        else {
          local_1c8 = units._M_string_length;
          pcStack_1c0 = units._M_dataplus._M_p;
          units_01._M_str = units._M_dataplus._M_p;
          units_01._M_len = units._M_string_length;
          name_00._M_str = name._M_dataplus._M_p;
          name_00._M_len = name._M_string_length;
          type_01._M_str = type._M_dataplus._M_p;
          type_01._M_len = type._M_string_length;
          callback.pubObj = registerPublication(local_440,name_00,type_01,units_01);
        }
        std::__cxx11::string::~string((string *)&units);
        std::__cxx11::string::~string((string *)&type);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3e8,"flags",(allocator<char> *)&local_208);
      info._M_string_length = (size_type)local_440;
      info._M_dataplus._M_p = (pointer)callback.pubObj;
      toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)&type);
      peVar16 = toml::find_or<toml::type_config,std::__cxx11::string>
                          (pbVar22,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3e8,(basic_value<toml::type_config> *)&type);
      toml::basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)&units,peVar16);
      if ((char)units._M_dataplus._M_p != '\0') {
        if ((char)units._M_dataplus._M_p == '\t') {
          paVar15 = toml::basic_value<toml::type_config>::as_array
                              ((basic_value<toml::type_config> *)&units);
          pbVar2 = (paVar15->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar23 = (paVar15->
                         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar2;
              pbVar23 = pbVar23 + 1) {
            psVar17 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar23);
            loadOptions<toml::basic_value<toml::type_config>,_helics::Publication>::
            anon_class_16_2_5e8ce78e::operator()((anon_class_16_2_5e8ce78e *)&info,psVar17);
          }
        }
        else {
          psVar17 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                              ((basic_value<toml::type_config> *)&units);
          loadOptions<toml::basic_value<toml::type_config>,_helics::Publication>::
          anon_class_16_2_5e8ce78e::operator()((anon_class_16_2_5e8ce78e *)&info,psVar17);
        }
      }
      if (*(char *)(local_3e8._0_8_ + (long)(local_3e8._8_8_ + -1)) == 's') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8);
        units_1._M_dataplus._M_p = (pointer)&units_1.field_2;
        units_1._M_string_length = 0;
        units_1.field_2._M_allocated_capacity =
             units_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pbVar18 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                            (pbVar22,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_3e8,&units_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&units_1,pbVar18);
        if (units_1._M_string_length != 0) {
          loadOptions<toml::basic_value<toml::type_config>,_helics::Publication>::
          anon_class_16_2_5e8ce78e::operator()((anon_class_16_2_5e8ce78e *)&info,&units_1);
        }
        std::__cxx11::string::~string((string *)&units_1);
      }
      toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&units);
      toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&type);
      std::__cxx11::string::~string((string *)local_3e8);
      type._M_dataplus._M_p = (pointer)0x0;
      type._M_string_length = 0;
      type.field_2._8_8_ =
           std::
           _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
           ::_M_invoke;
      type.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
           ::_M_manager;
      units._M_dataplus._M_p = (pointer)0x0;
      units._M_string_length = 0;
      units.field_2._8_8_ =
           std::
           _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
           ::_M_invoke;
      units_1._M_string_length = 0;
      units.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
           ::_M_manager;
      units_1.field_2._8_8_ =
           std::
           _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
           ::_M_invoke;
      units_1.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
           ::_M_manager;
      units_1._M_dataplus._M_p = (pointer)callback.pubObj;
      processOptions(pbVar22,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&type,
                     (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&units,(function<void_(int,_int)> *)&units_1);
      std::_Function_base::~_Function_base((_Function_base *)&units_1);
      std::_Function_base::~_Function_base((_Function_base *)&units);
      std::_Function_base::~_Function_base((_Function_base *)&type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"alias",(allocator<char> *)&units_1);
      units._M_string_length = (size_type)local_440;
      units.field_2._8_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
           ::_M_invoke;
      units.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
           ::_M_manager;
      units._M_dataplus._M_p = (pointer)callback.pubObj;
      fileops::callIfMember
                (pbVar22,&type,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&units);
      std::_Function_base::~_Function_base((_Function_base *)&units);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"tolerance",(allocator<char> *)&units);
      local_411._1_8_ = fileops::getOrDefault(pbVar22,&type,-1.0);
      std::__cxx11::string::~string((string *)&type);
      if (0.0 < (double)local_411._1_8_) {
        if ((callback.pubObj)->delta <= 0.0 && (callback.pubObj)->delta != 0.0) {
          (callback.pubObj)->changeDetectionEnabled = true;
        }
        (callback.pubObj)->delta = (double)local_411._1_8_;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"info",(allocator<char> *)&units);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = in_R9;
      fileops::getOrDefault
                (&info,(fileops *)pbVar22,(basic_value<toml::type_config> *)&type,(string *)0x0,
                 (string_view)(auVar5 << 0x40));
      std::__cxx11::string::~string((string *)&type);
      if (info._M_string_length != 0) {
        info_00._M_str = info._M_dataplus._M_p;
        info_00._M_len = info._M_string_length;
        Interface::setInfo(&(callback.pubObj)->super_Interface,info_00);
      }
      type._M_string_length = 0;
      type.field_2._8_8_ =
           std::
           _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
           ::_M_invoke;
      type.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
           ::_M_manager;
      type._M_dataplus._M_p = (pointer)callback.pubObj;
      loadTags(pbVar22,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)&type);
      std::_Function_base::~_Function_base((_Function_base *)&type);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"targets",local_411);
      toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)&type);
      peVar16 = toml::find_or<toml::type_config,std::__cxx11::string>
                          (pbVar22,&local_208,(basic_value<toml::type_config> *)&type);
      toml::basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)&units,peVar16);
      if ((char)units._M_dataplus._M_p != '\0') {
        if ((char)units._M_dataplus._M_p == '\t') {
          paVar15 = toml::basic_value<toml::type_config>::as_array
                              ((basic_value<toml::type_config> *)&units);
          pbVar2 = (paVar15->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar23 = (paVar15->
                         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar2;
              pbVar23 = pbVar23 + 1) {
            psVar17 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar23);
            target_00._M_str = (psVar17->_M_dataplus)._M_p;
            target_00._M_len = psVar17->_M_string_length;
            Publication::addTarget(callback.pubObj,target_00);
          }
        }
        else {
          psVar17 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                              ((basic_value<toml::type_config> *)&units);
          target_01._M_str = (psVar17->_M_dataplus)._M_p;
          target_01._M_len = psVar17->_M_string_length;
          Publication::addTarget(callback.pubObj,target_01);
        }
      }
      if (local_208._M_dataplus._M_p[local_208._M_string_length - 1] == 's') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  (&local_208);
        units_1._M_dataplus._M_p = (pointer)&units_1.field_2;
        units_1._M_string_length = 0;
        units_1.field_2._M_allocated_capacity =
             units_1.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pbVar18 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                            (pbVar22,&local_208,&units_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&units_1,pbVar18);
        if (units_1._M_string_length != 0) {
          target_02._M_str = units_1._M_dataplus._M_p;
          target_02._M_len = units_1._M_string_length;
          Publication::addTarget(callback.pubObj,target_02);
        }
        std::__cxx11::string::~string((string *)&units_1);
      }
      toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&units);
      toml::basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&type);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&info);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"destination",(allocator<char> *)&units);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"inputs",(allocator<char> *)&units_1);
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__0>
                (pbVar22,&type,&local_118,callback);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"destination",(allocator<char> *)&units);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"targets",(allocator<char> *)&units_1);
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__0>
                (pbVar22,&type,&local_138,callback);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::~string((string *)&name);
      pvVar21 = extraout_RDX_00;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"subscriptions",(allocator<char> *)&units);
  bVar13 = fileops::isMember(&doc,&type);
  std::__cxx11::string::~string((string *)&type);
  if (bVar13) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"subscriptions",(allocator<char> *)&units);
    pvVar14 = toml::basic_value<toml::type_config>::at(&doc,&type);
    std::__cxx11::string::~string((string *)&type);
    if (pvVar14->type_ != array) {
      pIVar20 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message_00._M_str = "subscriptions section in toml file must be an array";
      message_00._M_len = 0x33;
      InvalidParameter::InvalidParameter(pIVar20,message_00);
      __cxa_throw(pIVar20,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar15 = toml::basic_value<toml::type_config>::as_array(pvVar14);
    local_411._1_8_ =
         (paVar15->
         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    pvVar21 = extraout_RDX_01;
    for (pbVar22 = (paVar15->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar22 != (pointer)local_411._1_8_;
        pbVar22 = pbVar22 + 1) {
      fileops::getName_abi_cxx11_(&type,(fileops *)pbVar22,pvVar21);
      sVar12 = type._M_string_length;
      if (type._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&units,"target",(allocator<char> *)&units_1);
        fileops::replaceIfMember(pbVar22,&units,&type);
        std::__cxx11::string::~string((string *)&units);
      }
      key_01._M_str = type._M_dataplus._M_p;
      key_01._M_len = type._M_string_length;
      aVar19.inp = ValueFederateManager::getInputByTarget
                             ((local_440->vfManager)._M_t.
                              super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                              .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                              _M_head_impl,key_01);
      if (((aVar19.inp)->super_Interface).handle.hid == -1700000000) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&units_1,"type",(allocator<char> *)local_3e8);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = in_R9;
        fileops::getOrDefault
                  (&units,(fileops *)pbVar22,(value *)&units_1,(string *)0x0,
                   (string_view)(auVar6 << 0x40));
        std::__cxx11::string::~string((string *)&units_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3e8,"unit",(allocator<char> *)&info);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = in_R9;
        fileops::getOrDefault
                  (&units_1,(fileops *)pbVar22,(value *)local_3e8,(string *)0x0,
                   (string_view)(auVar7 << 0x40));
        std::__cxx11::string::~string((string *)local_3e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3e8,"units",(allocator<char> *)&info);
        fileops::replaceIfMember(pbVar22,(string *)local_3e8,&units_1);
        std::__cxx11::string::~string((string *)local_3e8);
        local_1d8 = units_1._M_string_length;
        pcStack_1d0 = units_1._M_dataplus._M_p;
        units_02._M_str = units_1._M_dataplus._M_p;
        units_02._M_len = units_1._M_string_length;
        type_02._M_str = units._M_dataplus._M_p;
        type_02._M_len = units._M_string_length;
        aVar19.inp = registerInput(local_440,(string_view)ZEXT816(0),type_02,units_02);
        if (sVar12 != 0) {
          target_03._M_str = type._M_dataplus._M_p;
          target_03._M_len = type._M_string_length;
          Input::addPublication(aVar19.inp,target_03);
        }
        std::__cxx11::string::~string((string *)&units_1);
        std::__cxx11::string::~string((string *)&units);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&units_1,"default",(allocator<char> *)local_3e8);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = in_R9;
      fileops::getOrDefault
                (&units,(fileops *)pbVar22,(value *)&units_1,(string *)0x0,
                 (string_view)(auVar8 << 0x40));
      std::__cxx11::string::~string((string *)&units_1);
      if (units._M_string_length != 0) {
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     *)&(aVar19.inp)->lastValue,&units);
      }
      loadOptions<toml::basic_value<toml::type_config>,helics::Input>(local_440,pbVar22,aVar19.inp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&units_1,"source",(allocator<char> *)local_3e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"publications",(allocator<char> *)&info);
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__1>
                (pbVar22,&units_1,&local_158,aVar19);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&units_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&units_1,"source",(allocator<char> *)local_3e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"targets",(allocator<char> *)&info);
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__1>
                (pbVar22,&units_1,&local_178,aVar19);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&units_1);
      std::__cxx11::string::~string((string *)&units);
      std::__cxx11::string::~string((string *)&type);
      pvVar21 = extraout_RDX_02;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&type,"inputs",(allocator<char> *)&units);
  bVar13 = fileops::isMember(&doc,&type);
  std::__cxx11::string::~string((string *)&type);
  if (bVar13) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"inputs",(allocator<char> *)&units);
    pvVar14 = toml::basic_value<toml::type_config>::at(&doc,&type);
    std::__cxx11::string::~string((string *)&type);
    if (pvVar14->type_ != array) {
      pIVar20 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message_01._M_str = "inputs section in toml file must be an array";
      message_01._M_len = 0x2c;
      InvalidParameter::InvalidParameter(pIVar20,message_01);
      __cxa_throw(pIVar20,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar15 = toml::basic_value<toml::type_config>::as_array(pvVar14);
    local_411._1_8_ =
         (paVar15->
         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    pvVar21 = extraout_RDX_03;
    for (pbVar22 = (paVar15->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar22 != (pointer)local_411._1_8_;
        pbVar22 = pbVar22 + 1) {
      fileops::getName_abi_cxx11_(&type,(fileops *)pbVar22,pvVar21);
      key_02._M_str = type._M_dataplus._M_p;
      key_02._M_len = type._M_string_length;
      aVar19.inp = ValueFederateManager::getInput
                             ((local_440->vfManager)._M_t.
                              super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                              .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                              _M_head_impl,key_02);
      if (((aVar19.inp)->super_Interface).handle.hid == -1700000000) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&units_1,"type",(allocator<char> *)local_3e8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = in_R9;
        fileops::getOrDefault
                  (&units,(fileops *)pbVar22,(value *)&units_1,(string *)0x0,
                   (string_view)(auVar9 << 0x40));
        std::__cxx11::string::~string((string *)&units_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3e8,"unit",(allocator<char> *)&info);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = in_R9;
        fileops::getOrDefault
                  (&units_1,(fileops *)pbVar22,(value *)local_3e8,(string *)0x0,
                   (string_view)(auVar10 << 0x40));
        std::__cxx11::string::~string((string *)local_3e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3e8,"units",(allocator<char> *)&info);
        fileops::replaceIfMember(pbVar22,(string *)local_3e8,&units_1);
        std::__cxx11::string::~string((string *)local_3e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3e8,"global",(allocator<char> *)&info);
        bVar13 = fileops::getOrDefault(pbVar22,(string *)local_3e8,defaultGlobal);
        std::__cxx11::string::~string((string *)local_3e8);
        if (bVar13) {
          local_3e8._0_8_ = units_1._M_string_length;
          local_3e8._8_8_ = units_1._M_dataplus._M_p;
          units_03._M_str = units_1._M_dataplus._M_p;
          units_03._M_len = units_1._M_string_length;
          key_03._M_str = type._M_dataplus._M_p;
          key_03._M_len = type._M_string_length;
          type_03._M_str = units._M_dataplus._M_p;
          type_03._M_len = units._M_string_length;
          aVar19.inp = ValueFederateManager::registerInput
                                 ((local_440->vfManager)._M_t.
                                  super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                                  .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>.
                                  _M_head_impl,key_03,type_03,units_03);
        }
        else {
          local_1e8 = units_1._M_string_length;
          pcStack_1e0 = units_1._M_dataplus._M_p;
          units_04._M_str = units_1._M_dataplus._M_p;
          units_04._M_len = units_1._M_string_length;
          name_01._M_str = type._M_dataplus._M_p;
          name_01._M_len = type._M_string_length;
          type_04._M_str = units._M_dataplus._M_p;
          type_04._M_len = units._M_string_length;
          aVar19.inp = registerInput(local_440,name_01,type_04,units_04);
        }
        std::__cxx11::string::~string((string *)&units_1);
        std::__cxx11::string::~string((string *)&units);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&units_1,"default",(allocator<char> *)local_3e8);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = in_R9;
      fileops::getOrDefault
                (&units,(fileops *)pbVar22,(value *)&units_1,(string *)0x0,
                 (string_view)(auVar11 << 0x40));
      std::__cxx11::string::~string((string *)&units_1);
      if (units._M_string_length != 0) {
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     *)&(aVar19.inp)->lastValue,&units);
      }
      loadOptions<toml::basic_value<toml::type_config>,helics::Input>(local_440,pbVar22,aVar19.inp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&units_1,"source",(allocator<char> *)local_3e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_198,"publications",(allocator<char> *)&info);
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
                (pbVar22,&units_1,&local_198,aVar19);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&units_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&units_1,"source",(allocator<char> *)local_3e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"targets",(allocator<char> *)&info);
      addTargetVariations<toml::basic_value<toml::type_config>,helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__2>
                (pbVar22,&units_1,&local_1b8,aVar19);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&units_1);
      std::__cxx11::string::~string((string *)&units);
      std::__cxx11::string::~string((string *)&type);
      pvVar21 = extraout_RDX_04;
    }
  }
  toml::basic_value<toml::type_config>::~basic_value(&doc);
  return;
}

Assistant:

void ValueFederate::registerValueInterfacesToml(const std::string& tomlString)
{
    using fileops::getOrDefault;
    using fileops::isMember;
    using fileops::replaceIfMember;

    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }
    bool defaultGlobal = false;
    replaceIfMember(doc, "defaultglobal", defaultGlobal);

    if (isMember(doc, "publications")) {
        auto& pubs = toml::find(doc, "publications");
        if (!pubs.is_array()) {
            throw(helics::InvalidParameter("publications section in toml file must be an array"));
        }
        auto& pubArray = pubs.as_array();
        for (const auto& pub : pubArray) {
            auto name = fileops::getName(pub);

            Publication* pubObj = &vfManager->getPublication(name);
            if (!pubObj->isValid()) {
                auto type = getOrDefault(pub, "type", emptyStr);
                auto units = getOrDefault(pub, "unit", emptyStr);
                replaceIfMember(pub, "units", units);
                const bool global = getOrDefault(pub, "global", defaultGlobal);
                if (global) {
                    pubObj = &registerGlobalPublication(name, type, units);
                } else {
                    pubObj = &registerPublication(name, type, units);
                }
            }
            loadOptions(this, pub, *pubObj);
            auto addDestTarget = [pubObj](const std::string& target) {
                pubObj->addDestinationTarget(target);
            };
            addTargetVariations(pub, "destination", "inputs", addDestTarget);
            addTargetVariations(pub, "destination", "targets", addDestTarget);
        }
    }
    if (isMember(doc, "subscriptions")) {
        auto& subs = toml::find(doc, "subscriptions");
        if (!subs.is_array()) {
            // this line is tested in the publications section so not really necessary to check
            // again since it is an expensive test
            throw(helics::InvalidParameter(
                "subscriptions section in toml file must be an array"));  // LCOV_EXCL_LINE
        }
        auto& subArray = subs.as_array();
        for (const auto& sub : subArray) {
            auto name = fileops::getName(sub);
            bool skipNameTarget{false};
            if (name.empty()) {
                fileops::replaceIfMember(sub, "target", name);
                skipNameTarget = true;
            }
            Input* inp = &vfManager->getInputByTarget(name);
            if (!inp->isValid()) {
                auto type = getOrDefault(sub, "type", emptyStr);
                auto units = getOrDefault(sub, "unit", emptyStr);
                replaceIfMember(sub, "units", units);

                inp = &registerInput(emptyStr, type, units);
                if (!skipNameTarget) {
                    // this check is to prevent some warnings since targets get added later
                    inp->addTarget(name);
                }
            }
            auto defStr = fileops::getOrDefault(sub, "default", emptyStr);
            if (!defStr.empty()) {
                inp->setDefault(defStr);
            }
            loadOptions(this, sub, *inp);
            auto addDestTarget = [inp](const std::string& target) { inp->addSourceTarget(target); };
            addTargetVariations(sub, "source", "publications", addDestTarget);
            addTargetVariations(sub, "source", "targets", addDestTarget);
        }
    }
    if (isMember(doc, "inputs")) {
        auto& ipts = toml::find(doc, "inputs");
        if (!ipts.is_array()) {
            throw(helics::InvalidParameter(
                "inputs section in toml file must be an array"));  // LCOV_EXCL_LINE
        }
        auto& iptArray = ipts.as_array();
        for (const auto& ipt : iptArray) {
            auto name = fileops::getName(ipt);

            Input* inp = &vfManager->getInput(name);
            if (!inp->isValid()) {
                auto type = getOrDefault(ipt, "type", emptyStr);
                auto units = getOrDefault(ipt, "unit", emptyStr);
                replaceIfMember(ipt, "units", units);
                const bool global = getOrDefault(ipt, "global", defaultGlobal);
                if (global) {
                    inp = &registerGlobalInput(name, type, units);
                } else {
                    inp = &registerInput(name, type, units);
                }
            }
            auto defStr = fileops::getOrDefault(ipt, "default", emptyStr);
            if (!defStr.empty()) {
                inp->setDefault(defStr);
            }
            loadOptions(this, ipt, *inp);
            auto addDestTarget = [inp](const std::string& target) { inp->addSourceTarget(target); };
            addTargetVariations(ipt, "source", "publications", addDestTarget);
            addTargetVariations(ipt, "source", "targets", addDestTarget);
        }
    }
}